

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O3

void free_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  uint32_t uVar1;
  size_t sVar2;
  char *__ptr;
  cstring_r *__ptr_00;
  ulong uVar3;
  
  uVar1 = (node->base).refcount;
  if (uVar1 != 0) {
    (node->base).refcount = uVar1 - 1;
    return;
  }
  __ptr_00 = node->identifiers;
  if (__ptr_00 != (cstring_r *)0x0) {
    sVar2 = __ptr_00->n;
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        if (uVar3 < node->identifiers->n) {
          __ptr = node->identifiers->p[uVar3];
        }
        else {
          __ptr = (char *)0x0;
        }
        free(__ptr);
        uVar3 = uVar3 + 1;
      } while (sVar2 != uVar3);
      __ptr_00 = node->identifiers;
      if (__ptr_00 == (cstring_r *)0x0) goto LAB_00137fe7;
    }
    if (__ptr_00->p != (char **)0x0) {
      free(__ptr_00->p);
      __ptr_00 = node->identifiers;
    }
    free(__ptr_00);
  }
LAB_00137fe7:
  free(node);
  return;
}

Assistant:

static void free_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    #pragma unused(self)
    CHECK_REFCOUNT(node);
    cstring_array_each(node->identifiers, {
        mem_free((void *)val);
    });

    if (node->identifiers) gnode_array_free(node->identifiers);
    mem_free((void *)node);
}